

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O2

int qc_list_inserttail2(QcList *list,void *data,QcListEntry **pp_entry)

{
  QcListEntry *pQVar1;
  QcList *pQVar2;
  
  if (list == (QcList *)0x0) {
    fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
            ,0x229);
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
                  ,0x229,"int qc_list_inserttail2(QcList *, void *, QcListEntry **)");
  }
  if (data != (void *)0x0) {
    pQVar1 = (QcListEntry *)calloc(1,0x18);
    if (pQVar1 != (QcListEntry *)0x0) {
      pQVar1->data = data;
      pQVar2 = (QcList *)list->tail;
      pQVar1->prev = (QcListEntry *)pQVar2;
      if (pQVar2 == (QcList *)0x0) {
        pQVar2 = list;
      }
      pQVar2->head = pQVar1;
      list->tail = pQVar1;
      list->count = list->count + 1;
      *pp_entry = pQVar1;
      return 0;
    }
    fprintf(_stderr,"malloc failed. [%s  line:%d]\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
            ,0x22c);
    __assert_fail("entry",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
                  ,0x22c,"int qc_list_inserttail2(QcList *, void *, QcListEntry **)");
  }
  fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
          ,0x22a);
  __assert_fail("data",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
                ,0x22a,"int qc_list_inserttail2(QcList *, void *, QcListEntry **)");
}

Assistant:

int qc_list_inserttail2(QcList *list, void *data, QcListEntry **pp_entry)
{
    QcListEntry *entry;

    qc_assert(list);
    qc_assert(data);

    qc_malloc(entry, sizeof(struct __QcListEntry));
    if(!entry)
    {
        *pp_entry = NULL;
        return -1;
    }

    entry->data = data;
    entry->next = NULL;

    entry->prev = list->tail;

    if(!list->tail)
    {
        list->head = entry;
    }
    else
    {
        list->tail->next = entry;
    }

    list->tail = entry;
    list->count++;
    *pp_entry  = entry;
    
    return 0;
}